

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

TableViewSection * __thiscall QtMWidgets::TableView::removeSection(TableView *this,int index)

{
  TableViewSection *pTVar1;
  TableViewPrivate *pTVar2;
  qsizetype qVar3;
  const_reference ppTVar4;
  TableViewSection *s;
  TableViewPrivate *d;
  int index_local;
  TableView *this_local;
  
  pTVar2 = d_func(this);
  if ((-1 < index) &&
     (qVar3 = QList<QtMWidgets::TableViewSection_*>::size(&pTVar2->sections), index < qVar3)) {
    ppTVar4 = QList<QtMWidgets::TableViewSection_*>::at(&pTVar2->sections,(long)index);
    pTVar1 = *ppTVar4;
    QLayout::removeWidget((QWidget *)pTVar2->layout);
    QWidget::setParent(&pTVar1->super_QWidget);
    QWidget::hide();
    QList<QtMWidgets::TableViewSection_*>::removeAt(&pTVar2->sections,(long)index);
    QWidget::adjustSize();
    return pTVar1;
  }
  return (TableViewSection *)0x0;
}

Assistant:

TableViewSection *
TableView::removeSection( int index )
{
	TableViewPrivate * d = d_func();

	if( index >= 0 && index < d->sections.size() )
	{
		TableViewSection * s = d->sections.at( index );

		d->layout->removeWidget( s );
		s->setParent( 0 );
		s->hide();

		d->sections.removeAt( index );

		d->widget->adjustSize();

		return s;
	}
	else
		return 0;
}